

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnRt4PalCommand::Execute(DrawColumnRt4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint8_t *puVar9;
  int iVar10;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar4 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar10 = thread->pass_end_y - iVar1;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar4 < iVar10) {
    iVar10 = iVar4;
  }
  iVar4 = thread->num_cores;
  uVar6 = thread->pass_start_y - iVar1;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar7 = (iVar4 - (int)((iVar1 + uVar6) - thread->core) % iVar4) % iVar4;
  uVar3 = (long)(int)((~uVar6 + iVar4 + iVar10) - iVar7) / (long)iVar4;
  if (0 < (int)uVar3) {
    puVar2 = (this->super_PalRtCommand)._colormap;
    iVar7 = iVar1 + uVar6 + iVar7;
    puVar9 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar7];
    pbVar5 = thread->dc_temp + (iVar7 / iVar4 << 2);
    iVar4 = iVar4 * (this->super_PalRtCommand)._pitch;
    if ((uVar3 & 1) != 0) {
      *puVar9 = puVar2[*pbVar5];
      puVar9[1] = puVar2[pbVar5[1]];
      puVar9[2] = puVar2[pbVar5[2]];
      puVar9[3] = puVar2[pbVar5[3]];
      pbVar5 = pbVar5 + 4;
      puVar9 = puVar9 + iVar4;
    }
    if ((int)uVar3 != 1) {
      lVar8 = 0;
      do {
        *puVar9 = puVar2[pbVar5[lVar8 * 8]];
        puVar9[1] = puVar2[pbVar5[lVar8 * 8 + 1]];
        puVar9[2] = puVar2[pbVar5[lVar8 * 8 + 2]];
        puVar9[3] = puVar2[pbVar5[lVar8 * 8 + 3]];
        puVar9[iVar4] = puVar2[pbVar5[lVar8 * 8 + 4]];
        puVar9[iVar4 + 1] = puVar2[pbVar5[lVar8 * 8 + 5]];
        puVar9[iVar4 + 2] = puVar2[pbVar5[lVar8 * 8 + 6]];
        puVar9[iVar4 + 3] = puVar2[pbVar5[lVar8 * 8 + 7]];
        puVar9 = puVar9 + iVar4 * 2;
        lVar8 = lVar8 + 1;
      } while ((int)((uVar3 & 0xffffffff) >> 1) != (int)lVar8);
    }
  }
  return;
}

Assistant:

void DrawColumnRt4PalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch*thread->num_cores;
	
		if (count & 1) {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			source += 4;
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			dest[pitch] = colormap[source[4]];
			dest[pitch+1] = colormap[source[5]];
			dest[pitch+2] = colormap[source[6]];
			dest[pitch+3] = colormap[source[7]];
			source += 8;
			dest += pitch*2;
		} while (--count);
	}